

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwDestroyCursor(GLFWcursor *handle)

{
  _GLFWcursor *local_28;
  _GLFWcursor **prev;
  _GLFWwindow *window;
  _GLFWcursor *cursor;
  GLFWcursor *handle_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (handle != (GLFWcursor *)0x0) {
    for (prev = (_GLFWcursor **)_glfw.windowListHead; prev != (_GLFWcursor **)0x0;
        prev = &(*prev)->next) {
      if (prev[0xb] == (_GLFWcursor *)handle) {
        glfwSetCursor((GLFWwindow *)prev,(GLFWcursor *)0x0);
      }
    }
    _glfwPlatformDestroyCursor((_GLFWcursor *)handle);
    for (local_28 = (_GLFWcursor *)&_glfw.cursorListHead; local_28->next != (_GLFWcursor *)handle;
        local_28 = local_28->next) {
    }
    local_28->next = *(_GLFWcursor **)handle;
    free(handle);
  }
  return;
}

Assistant:

GLFWAPI void glfwDestroyCursor(GLFWcursor* handle)
{
    _GLFWcursor* cursor = (_GLFWcursor*) handle;

    _GLFW_REQUIRE_INIT();

    if (cursor == NULL)
        return;

    // Make sure the cursor is not being used by any window
    {
        _GLFWwindow* window;

        for (window = _glfw.windowListHead;  window;  window = window->next)
        {
            if (window->cursor == cursor)
                glfwSetCursor((GLFWwindow*) window, NULL);
        }
    }

    _glfwPlatformDestroyCursor(cursor);

    // Unlink cursor from global linked list
    {
        _GLFWcursor** prev = &_glfw.cursorListHead;

        while (*prev != cursor)
            prev = &((*prev)->next);

        *prev = cursor->next;
    }

    free(cursor);
}